

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O2

int uv__async_spin(uv_async_t *handle)

{
  int iVar1;
  int iVar2;
  
  do {
    for (iVar2 = 0; iVar2 != 0x3e5; iVar2 = iVar2 + 1) {
      LOCK();
      iVar1 = handle->pending;
      if (iVar1 == 2) {
        handle->pending = 0;
        iVar1 = 2;
      }
      UNLOCK();
      if (iVar1 != 1) {
        return iVar1;
      }
    }
    sched_yield();
  } while( true );
}

Assistant:

static int uv__async_spin(uv_async_t* handle) {
  int i;
  int rc;

  for (;;) {
    /* 997 is not completely chosen at random. It's a prime number, acyclical
     * by nature, and should therefore hopefully dampen sympathetic resonance.
     */
    for (i = 0; i < 997; i++) {
      /* rc=0 -- handle is not pending.
       * rc=1 -- handle is pending, other thread is still working with it.
       * rc=2 -- handle is pending, other thread is done.
       */
      rc = cmpxchgi(&handle->pending, 2, 0);

      if (rc != 1)
        return rc;

      /* Other thread is busy with this handle, spin until it's done. */
      cpu_relax();
    }

    /* Yield the CPU. We may have preempted the other thread while it's
     * inside the critical section and if it's running on the same CPU
     * as us, we'll just burn CPU cycles until the end of our time slice.
     */
    sched_yield();
  }
}